

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShell::assertUnsignedLongsEqual
          (UtestShell *this,unsigned_long expected,unsigned_long actual,char *text,char *fileName,
          size_t lineNumber,TestTerminator *testTerminator)

{
  size_t lineNumber_00;
  size_t fileName_00;
  char *actual_00;
  unsigned_long expected_00;
  TestResult *pTVar1;
  SimpleString local_b0;
  UnsignedLongsEqualFailure local_a0;
  size_t local_38;
  size_t lineNumber_local;
  char *fileName_local;
  char *text_local;
  unsigned_long actual_local;
  unsigned_long expected_local;
  UtestShell *this_local;
  
  local_38 = lineNumber;
  lineNumber_local = (size_t)fileName;
  fileName_local = text;
  text_local = (char *)actual;
  actual_local = expected;
  expected_local = (unsigned_long)this;
  pTVar1 = getTestResult(this);
  (*pTVar1->_vptr_TestResult[10])();
  expected_00 = actual_local;
  actual_00 = text_local;
  fileName_00 = lineNumber_local;
  lineNumber_00 = local_38;
  if ((char *)actual_local != text_local) {
    SimpleString::SimpleString(&local_b0,fileName_local);
    UnsignedLongsEqualFailure::UnsignedLongsEqualFailure
              (&local_a0,this,(char *)fileName_00,lineNumber_00,expected_00,(unsigned_long)actual_00
               ,&local_b0);
    (*this->_vptr_UtestShell[0x27])(this,&local_a0,testTerminator);
    UnsignedLongsEqualFailure::~UnsignedLongsEqualFailure(&local_a0);
    SimpleString::~SimpleString(&local_b0);
  }
  return;
}

Assistant:

void UtestShell::assertUnsignedLongsEqual(unsigned long expected, unsigned long actual, const char* text, const char* fileName, size_t lineNumber, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
    if (expected != actual)
        failWith(UnsignedLongsEqualFailure (this, fileName, lineNumber, expected, actual, text), testTerminator);
}